

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

string * __thiscall
CLI::Validator::operator()(string *__return_storage_ptr__,Validator *this,string *str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_48 [8];
  string value;
  string *str_local;
  Validator *this_local;
  string *retstring;
  
  value.field_2._M_local_buf[0xf] = '\0';
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((this->active_ & 1U) != 0) {
    if ((this->non_modifying_ & 1U) == 0) {
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&local_98,&this->func_,str);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
      ::std::__cxx11::string::~string((string *)&local_98);
    }
    else {
      ::std::__cxx11::string::string((string *)local_48,(string *)str);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&local_78,&this->func_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
      ::std::__cxx11::string::~string((string *)local_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(std::string &str) const {
        std::string retstring;
        if(active_) {
            if(non_modifying_) {
                std::string value = str;
                retstring = func_(value);
            } else {
                retstring = func_(str);
            }
        }
        return retstring;
    }